

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

void secp256k1_selftest(void)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong in_RCX;
  uchar *p1;
  ulong uVar6;
  int *piVar7;
  uchar out [32];
  byte local_98 [32];
  secp256k1_sha256 local_78;
  
  local_78.s[0] = 0x6a09e667;
  local_78.s[1] = 0xbb67ae85;
  local_78.s[2] = 0x3c6ef372;
  local_78.s[3] = 0xa54ff53a;
  local_78.s[4] = 0x510e527f;
  local_78.s[5] = 0x9b05688c;
  local_78.s[6] = 0x1f83d9ab;
  local_78.s[7] = 0x5be0cd19;
  local_78.bytes = 0;
  secp256k1_sha256_write
            (&local_78,(uchar *)"For this sample, this 63-byte string will be used as input data",
             0x3f);
  secp256k1_sha256_finalize(&local_78,local_98);
  lVar4 = 0;
  do {
    uVar6 = in_RCX & 0xffffffff;
    bVar1 = local_98[lVar4];
    piVar7 = (int *)(ulong)bVar1;
    bVar2 = (&secp256k1_selftest_sha256_output32)[lVar4];
    in_RCX = (ulong)((uint)bVar1 - (uint)bVar2);
    if (bVar1 == bVar2) {
      in_RCX = uVar6;
    }
    iVar5 = (int)in_RCX;
    if (bVar1 != bVar2) goto LAB_00113d91;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x20);
  iVar5 = 0;
LAB_00113d91:
  if (iVar5 == 0) {
    return;
  }
  secp256k1_selftest_cold_1();
  if ((char)piVar7 == '\x01') {
    uVar6 = (ulong)((long)piVar7 << 3) >> 0x33;
    uVar3 = (((long)piVar7 << 3 | (ulong)piVar7 >> 0x3d) << 0xd | uVar6) >> 3;
    uVar6 = (uVar6 << 0x3d | uVar3) >> 0xd;
    piVar7 = (int *)(uVar3 << 0x33 | uVar6);
    if (((uint)uVar6 >> 10 & 1) == 0) {
      return;
    }
  }
  else {
    secp256k1_context_preallocated_size_cold_1();
  }
  secp256k1_context_preallocated_size_cold_2();
  if (*piVar7 != 0) {
    return;
  }
  secp256k1_context_preallocated_clone_size_cold_1();
  return;
}

Assistant:

void secp256k1_selftest(void) {
    if (!secp256k1_selftest_passes()) {
        secp256k1_callback_call(&default_error_callback, "self test failed");
    }
}